

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgaimage.cpp
# Opt level: O2

bool __thiscall TGAImage::load_rle_data(TGAImage *this,ifstream *in)

{
  char cVar1;
  size_t t;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  TGAColor colorbuffer;
  uchar local_48 [8];
  ulong local_40;
  ulong local_38;
  
  uVar2 = (ulong)(this->height * this->width);
  local_48[4] = 0;
  local_48[0] = '\0';
  local_48[1] = '\0';
  local_48[2] = '\0';
  local_48[3] = '\0';
  lVar3 = 0;
  uVar6 = 0;
  while (cVar1 = std::istream::get(), *(int *)(in + *(long *)(*(long *)in + -0x18) + 0x20) == 0) {
    if (cVar1 < '\0') {
      std::istream::read((char *)in,(long)local_48);
      if (*(int *)(in + *(long *)(*(long *)in + -0x18) + 0x20) != 0) {
LAB_00102e13:
        pcVar5 = "an error occurred while reading the header\n";
        goto LAB_00102e1a;
      }
      uVar4 = (byte)(cVar1 + 0x81) + uVar6;
      while (uVar6 != uVar4) {
        for (uVar7 = 0; uVar7 < this->bytespp; uVar7 = uVar7 + 1) {
          (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[lVar3] = local_48[uVar7];
          lVar3 = lVar3 + 1;
        }
        uVar6 = uVar6 + 1;
        if (uVar2 < uVar6) goto LAB_00102e0a;
      }
    }
    else {
      local_38 = (ulong)(byte)(cVar1 + 1);
      uVar4 = uVar6 + local_38;
      uVar7 = 0;
      local_40 = uVar2;
      while (uVar2 = local_40, uVar7 != local_38) {
        std::istream::read((char *)in,(long)local_48);
        if (*(int *)(in + *(long *)(*(long *)in + -0x18) + 0x20) != 0) goto LAB_00102e13;
        for (uVar2 = 0; uVar2 < this->bytespp; uVar2 = uVar2 + 1) {
          (this->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start[lVar3] = local_48[uVar2];
          lVar3 = lVar3 + 1;
        }
        uVar6 = uVar6 + 1;
        uVar7 = uVar7 + 1;
        if (local_40 < uVar6) goto LAB_00102e0a;
      }
    }
    uVar6 = uVar4;
    if (uVar2 <= uVar4) {
      return true;
    }
  }
  pcVar5 = "an error occurred while reading the data\n";
LAB_00102e1a:
  std::operator<<((ostream *)&std::cerr,pcVar5);
  return false;
LAB_00102e0a:
  pcVar5 = "Too many pixels read\n";
  goto LAB_00102e1a;
}

Assistant:

bool TGAImage::load_rle_data(std::ifstream &in)
{
    size_t pixelcount = width * height;
    size_t currentpixel = 0;
    size_t currentbyte = 0;
    TGAColor colorbuffer;
    do {
        std::uint8_t chunkheader = 0;
        chunkheader = in.get();
        if (!in.good()) {
            std::cerr << "an error occurred while reading the data\n";
            return false;
        }
        if (chunkheader < 128) {
            chunkheader++;
            for (size_t i = 0; i < chunkheader; i++) {
                in.read(reinterpret_cast<char *>(colorbuffer.bgra), bytespp);
                if (!in.good()) {
                    std::cerr << "an error occurred while reading the header\n";
                    return false;
                }
                for (size_t t = 0; t < bytespp; t++) data[currentbyte++] = colorbuffer.bgra[t];
                currentpixel++;
                if (currentpixel > pixelcount) {
                    std::cerr << "Too many pixels read\n";
                    return false;
                }
            }
        } else {
            chunkheader -= 127;
            in.read(reinterpret_cast<char *>(colorbuffer.bgra), bytespp);
            if (!in.good()) {
                std::cerr << "an error occurred while reading the header\n";
                return false;
            }
            for (size_t i = 0; i < chunkheader; i++) {
                for (size_t t = 0; t < bytespp; t++) data[currentbyte++] = colorbuffer.bgra[t];
                currentpixel++;
                if (currentpixel > pixelcount) {
                    std::cerr << "Too many pixels read\n";
                    return false;
                }
            }
        }
    } while (currentpixel < pixelcount);
    return true;
}